

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.hpp
# Opt level: O2

int __thiscall
soplex::
SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeave(SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,
             number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *param_2,bool param_3)

{
  uint *puVar1;
  long *plVar2;
  undefined8 uVar3;
  type_conflict5 tVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar8;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  double *pdVar9;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  long lVar10;
  uint n;
  ulong uVar11;
  int local_48c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_438;
  cpp_dec_float<50U,_int,_void> local_3f8;
  cpp_dec_float<50U,_int,_void> local_3b8;
  long local_378;
  long local_370;
  ulong local_368;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_360;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_358;
  cpp_dec_float<50U,_int,_void> local_318;
  long local_2e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  degeneps;
  double local_220;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_198;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_158;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_118;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxabs;
  cpp_dec_float<50U,_int,_void> local_68;
  undefined4 extraout_var_02;
  
  local_318.fpclass = cpp_dec_float_finite;
  local_318.prec_elem = 10;
  local_318.data._M_elems[0] = 0;
  local_318.data._M_elems[1] = 0;
  local_318.data._M_elems[2] = 0;
  local_318.data._M_elems[3] = 0;
  local_318.data._M_elems[4] = 0;
  local_318.data._M_elems[5] = 0;
  local_318.data._M_elems[6] = 0;
  local_318.data._M_elems[7] = 0;
  local_318.data._M_elems[8] = 0;
  local_318.data._M_elems[9] = 0;
  local_318.exp = 0;
  local_318.neg = false;
  local_438.fpclass = cpp_dec_float_finite;
  local_438.prec_elem = 10;
  local_438.data._M_elems[0] = 0;
  local_438.data._M_elems[1] = 0;
  local_438.data._M_elems[2] = 0;
  local_438.data._M_elems[3] = 0;
  local_438.data._M_elems[4] = 0;
  local_438.data._M_elems[5] = 0;
  local_438.data._M_elems[6] = 0;
  local_438.data._M_elems[7] = 0;
  local_438.data._M_elems[8] = 0;
  local_438.data._M_elems[9] = 0;
  local_438.exp = 0;
  local_438.neg = false;
  local_3f8.fpclass = cpp_dec_float_finite;
  local_3f8.prec_elem = 10;
  local_3f8.data._M_elems[0] = 0;
  local_3f8.data._M_elems[1] = 0;
  local_3f8.data._M_elems[2] = 0;
  local_3f8.data._M_elems[3] = 0;
  local_3f8.data._M_elems[4] = 0;
  local_3f8.data._M_elems[5] = 0;
  local_3f8.data._M_elems._24_5_ = 0;
  local_3f8.data._M_elems[7]._1_3_ = 0;
  local_3f8.data._M_elems._32_5_ = 0;
  local_3f8.data._M_elems[9]._1_3_ = 0;
  local_3f8.exp = 0;
  local_3f8.neg = false;
  local_3b8.fpclass = cpp_dec_float_finite;
  local_3b8.prec_elem = 10;
  local_3b8.data._M_elems[0] = 0;
  local_3b8.data._M_elems[1] = 0;
  local_3b8.data._M_elems[2] = 0;
  local_3b8.data._M_elems[3] = 0;
  local_3b8.data._M_elems[4] = 0;
  local_3b8.data._M_elems[5] = 0;
  local_3b8.data._M_elems._24_5_ = 0;
  local_3b8.data._M_elems[7]._1_3_ = 0;
  local_3b8.data._M_elems._32_5_ = 0;
  local_3b8.data._M_elems[9]._1_3_ = 0;
  local_3b8.exp = 0;
  local_3b8.neg = false;
  local_358.m_backend.fpclass = cpp_dec_float_finite;
  local_358.m_backend.prec_elem = 10;
  local_358.m_backend.data._M_elems[0] = 0;
  local_358.m_backend.data._M_elems[1] = 0;
  local_358.m_backend.data._M_elems[2] = 0;
  local_358.m_backend.data._M_elems[3] = 0;
  local_358.m_backend.data._M_elems[4] = 0;
  local_358.m_backend.data._M_elems[5] = 0;
  local_358.m_backend.data._M_elems._24_5_ = 0;
  local_358.m_backend.data._M_elems[7]._1_3_ = 0;
  local_358.m_backend.data._M_elems._32_5_ = 0;
  local_358.m_backend.data._M_elems[9]._1_3_ = 0;
  local_358.m_backend.exp = 0;
  local_358.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&maxabs.m_backend,1,(type *)0x0);
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::epsilon(&epsilon,(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT44(extraout_var,iVar6));
  degenerateEps(&degeneps,this);
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar10 = *(long *)(CONCAT44(extraout_var_00,iVar6) + 0xa48);
  local_360 = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)(lVar10 + 0x50);
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  plVar2 = *(long **)(CONCAT44(extraout_var_01,iVar6) + 0xa48);
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar8 = CONCAT44(extraout_var_02,iVar6);
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  local_370 = CONCAT44(extraout_var_03,iVar6);
  local_218.m_backend.data._M_elems[0] = (val->m_backend).data._M_elems[0];
  local_218.m_backend.data._M_elems[1] = (val->m_backend).data._M_elems[1];
  local_218.m_backend.data._M_elems[2] = (val->m_backend).data._M_elems[2];
  local_218.m_backend.data._M_elems[3] = (val->m_backend).data._M_elems[3];
  local_218.m_backend.data._M_elems[4] = (val->m_backend).data._M_elems[4];
  local_218.m_backend.data._M_elems[5] = (val->m_backend).data._M_elems[5];
  local_218.m_backend.data._M_elems[6] = (val->m_backend).data._M_elems[6];
  local_218.m_backend.data._M_elems[7] = (val->m_backend).data._M_elems[7];
  local_218.m_backend.data._M_elems._32_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 8);
  local_218.m_backend.exp = (val->m_backend).exp;
  local_218.m_backend.neg = (val->m_backend).neg;
  local_218.m_backend.fpclass = (val->m_backend).fpclass;
  local_218.m_backend.prec_elem = (val->m_backend).prec_elem;
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar6) + 0x368))
            (&result,(long *)CONCAT44(extraout_var_04,iVar6));
  local_d8.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
  local_d8.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
  local_d8.m_backend.data._M_elems[6] = result.m_backend.data._M_elems[6];
  local_d8.m_backend.data._M_elems[7] = result.m_backend.data._M_elems[7];
  local_d8.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
  local_d8.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
  local_d8.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
  local_d8.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
  local_d8.m_backend.exp = result.m_backend.exp;
  local_d8.m_backend.neg = result.m_backend.neg;
  local_d8.m_backend.fpclass = result.m_backend.fpclass;
  local_d8.m_backend.prec_elem = result.m_backend.prec_elem;
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(*(long *)(CONCAT44(extraout_var_05,iVar6) + 0xa48) + 0x50));
  tVar4 = boost::multiprecision::operator>(&local_218,&epsilon);
  local_378 = lVar10;
  local_2e0 = lVar8;
  if (tVar4) {
    maxDelta(this,&maxabs,&local_218,*(int *)(lVar10 + 0x58),*(int **)(lVar10 + 0x60),
             *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               **)(lVar10 + 0x70),
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)*plVar2,
             *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               **)(local_370 + 0xa28),
             *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               **)(lVar8 + 0xa10));
    bVar5 = boost::multiprecision::operator==(&local_218,val);
    if (bVar5) {
      return -1;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&local_318,0);
    pdVar9 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&result.m_backend,-*pdVar9,(type *)0x0);
    local_3b8.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
    local_3b8.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
    local_3b8.data._M_elems[4] = result.m_backend.data._M_elems[4];
    local_3b8.data._M_elems[5] = result.m_backend.data._M_elems[5];
    local_3b8.data._M_elems._24_5_ =
         SUB85(CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]),0);
    local_3b8.data._M_elems[7]._1_3_ = (undefined3)(result.m_backend.data._M_elems[7] >> 8);
    local_3b8.data._M_elems[0] = result.m_backend.data._M_elems[0];
    local_3b8.data._M_elems[1] = result.m_backend.data._M_elems[1];
    local_3b8.data._M_elems[2] = result.m_backend.data._M_elems[2];
    local_3b8.data._M_elems[3] = result.m_backend.data._M_elems[3];
    local_3b8.exp = result.m_backend.exp;
    local_3b8.neg = result.m_backend.neg;
    local_3b8.fpclass = result.m_backend.fpclass;
    local_3b8.prec_elem = result.m_backend.prec_elem;
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 10;
    result_2.m_backend.data._M_elems[0] = 0;
    result_2.m_backend.data._M_elems[1] = 0;
    result_2.m_backend.data._M_elems[2] = 0;
    result_2.m_backend.data._M_elems[3] = 0;
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems._24_5_ = 0;
    result_2.m_backend.data._M_elems[7]._1_3_ = 0;
    result_2.m_backend.data._M_elems._32_5_ = 0;
    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result_2.m_backend,&maxabs.m_backend,&epsilon.m_backend);
    local_220 = 0.001;
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 10;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems._32_5_ = 0;
    result.m_backend.data._M_elems[9]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
              (&result.m_backend,&result_2.m_backend,&local_220);
    local_358.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
    local_358.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
    local_358.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
    local_358.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
    local_358.m_backend.data._M_elems._24_5_ =
         SUB85(CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]),0);
    local_358.m_backend.data._M_elems[7]._1_3_ =
         (undefined3)(result.m_backend.data._M_elems[7] >> 8);
    local_358.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
    local_358.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
    local_358.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
    local_358.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
    local_358.m_backend.exp = result.m_backend.exp;
    local_358.m_backend.neg = result.m_backend.neg;
    local_358.m_backend.fpclass = result.m_backend.fpclass;
    local_358.m_backend.prec_elem = result.m_backend.prec_elem;
    tVar4 = boost::multiprecision::operator<
                      (&local_358,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&epsilon.m_backend);
    if (tVar4) {
      local_358.m_backend.data._M_elems._32_5_ = epsilon.m_backend.data._M_elems._32_5_;
      local_358.m_backend.data._M_elems[9]._1_3_ = epsilon.m_backend.data._M_elems[9]._1_3_;
      local_358.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
      local_358.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
      local_358.m_backend.data._M_elems._24_5_ = epsilon.m_backend.data._M_elems._24_5_;
      local_358.m_backend.data._M_elems[7]._1_3_ = epsilon.m_backend.data._M_elems[7]._1_3_;
      local_358.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
      local_358.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
      local_358.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
      local_358.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
      local_358.m_backend.exp = epsilon.m_backend.exp;
      local_358.m_backend.neg = epsilon.m_backend.neg;
      local_358.m_backend.fpclass = epsilon.m_backend.fpclass;
      local_358.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    }
    n = *(uint *)(local_378 + 0x58);
    local_48c = -1;
    while (0 < (int)n) {
      n = n - 1;
      iVar6 = *(int *)(*(long *)(local_378 + 0x60) + (ulong)n * 4);
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&result.m_backend,local_360,iVar6);
      local_438.data._M_elems[8] = result.m_backend.data._M_elems[8];
      local_438.data._M_elems[9] =
           (uint)(CONCAT35(result.m_backend.data._M_elems[9]._1_3_,
                           result.m_backend.data._M_elems._32_5_) >> 0x20);
      local_438.data._M_elems[4] = result.m_backend.data._M_elems[4];
      local_438.data._M_elems[5] = result.m_backend.data._M_elems[5];
      local_438.data._M_elems[6] = result.m_backend.data._M_elems[6];
      local_438.data._M_elems[7] = result.m_backend.data._M_elems[7];
      local_438.data._M_elems[0] = result.m_backend.data._M_elems[0];
      local_438.data._M_elems[1] = result.m_backend.data._M_elems[1];
      local_438.data._M_elems[2] = result.m_backend.data._M_elems[2];
      local_438.data._M_elems[3] = result.m_backend.data._M_elems[3];
      local_438.exp = result.m_backend.exp;
      local_438.neg = result.m_backend.neg;
      local_438.fpclass = result.m_backend.fpclass;
      local_438.prec_elem = result.m_backend.prec_elem;
      tVar4 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_438,&local_358);
      if (tVar4) {
        lVar10 = (long)iVar6 * 0x38;
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 10;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems[6] = 0;
        result.m_backend.data._M_elems[7] = 0;
        result.m_backend.data._M_elems._32_5_ = 0;
        result.m_backend.data._M_elems[9]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result.m_backend,
                   (cpp_dec_float<50U,_int,_void> *)(*(long *)(local_2e0 + 0xa10) + lVar10),
                   (cpp_dec_float<50U,_int,_void> *)(*plVar2 + lVar10));
        local_3f8.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
        local_3f8.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
        local_3f8.data._M_elems[4] = result.m_backend.data._M_elems[4];
        local_3f8.data._M_elems[5] = result.m_backend.data._M_elems[5];
        local_3f8.data._M_elems._24_5_ =
             SUB85(CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]),0);
        local_3f8.data._M_elems[7]._1_3_ = (undefined3)(result.m_backend.data._M_elems[7] >> 8);
        local_3f8.data._M_elems[0] = result.m_backend.data._M_elems[0];
        local_3f8.data._M_elems[1] = result.m_backend.data._M_elems[1];
        local_3f8.data._M_elems[2] = result.m_backend.data._M_elems[2];
        local_3f8.data._M_elems[3] = result.m_backend.data._M_elems[3];
        local_3f8.exp = result.m_backend.exp;
        local_3f8.neg = result.m_backend.neg;
        local_3f8.fpclass = result.m_backend.fpclass;
        local_3f8.prec_elem = result.m_backend.prec_elem;
        result.m_backend.data._M_elems._32_5_ = degeneps.m_backend.data._M_elems._32_5_;
        result.m_backend.data._M_elems[9]._1_3_ = degeneps.m_backend.data._M_elems[9]._1_3_;
        result.m_backend.data._M_elems[4] = degeneps.m_backend.data._M_elems[4];
        result.m_backend.data._M_elems[5] = degeneps.m_backend.data._M_elems[5];
        result.m_backend.data._M_elems[6] = degeneps.m_backend.data._M_elems[6];
        result.m_backend.data._M_elems[7] = degeneps.m_backend.data._M_elems[7];
        result.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
        result.m_backend.data._M_elems[1] = degeneps.m_backend.data._M_elems[1];
        uVar3 = result.m_backend.data._M_elems._0_8_;
        result.m_backend.data._M_elems[2] = degeneps.m_backend.data._M_elems[2];
        result.m_backend.data._M_elems[3] = degeneps.m_backend.data._M_elems[3];
        result.m_backend.exp = degeneps.m_backend.exp;
        result.m_backend.neg = degeneps.m_backend.neg;
        result.m_backend.fpclass = degeneps.m_backend.fpclass;
        result.m_backend.prec_elem = degeneps.m_backend.prec_elem;
        result.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
        if (degeneps.m_backend.fpclass != cpp_dec_float_finite ||
            result.m_backend.data._M_elems[0] != 0) {
          result.m_backend.neg = (bool)(degeneps.m_backend.neg ^ 1);
        }
        result.m_backend.data._M_elems._0_8_ = uVar3;
        tVar4 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_3f8,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result.m_backend);
        if (tVar4) {
          iVar7 = (*(this->
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._vptr_SPxRatioTester[3])(this);
          lVar8 = *plVar2;
          local_118.m_backend.data._M_elems._0_8_ = *(undefined8 *)(lVar8 + lVar10);
          local_118.m_backend.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar8 + lVar10) + 2);
          puVar1 = (uint *)(lVar8 + 0x10 + lVar10);
          local_118.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          local_118.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
          local_118.m_backend.data._M_elems._32_8_ = *(undefined8 *)(lVar8 + 0x20 + lVar10);
          local_118.m_backend.exp = *(int *)(lVar8 + 0x28 + lVar10);
          local_118.m_backend.neg = *(bool *)(lVar8 + 0x2c + lVar10);
          local_118.m_backend._48_8_ = *(undefined8 *)(lVar8 + 0x30 + lVar10);
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::shiftUBbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)CONCAT44(extraout_var_06,iVar7),iVar6,&local_118);
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                    (&local_3f8,&local_438);
          tVar4 = boost::multiprecision::operator<=
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_3f8,&local_218);
          if (tVar4) {
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 10;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems._32_5_ = 0;
            result.m_backend.data._M_elems[9]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result.m_backend,&local_3b8,&epsilon.m_backend);
            tVar4 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_3f8,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&result.m_backend);
            if ((tVar4) &&
               (tVar4 = boost::multiprecision::operator>
                                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&local_438,
                                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&local_318), tVar4)) {
              local_318.neg = local_438.neg;
              local_48c = iVar6;
              local_3b8.data._M_elems._0_8_ = local_3f8.data._M_elems._0_8_;
              local_3b8.data._M_elems._8_8_ = local_3f8.data._M_elems._8_8_;
              local_3b8.data._M_elems._16_8_ = local_3f8.data._M_elems._16_8_;
              local_3b8.data._M_elems._24_5_ = local_3f8.data._M_elems._24_5_;
              local_3b8.data._M_elems[7]._1_3_ = local_3f8.data._M_elems[7]._1_3_;
              local_3b8.data._M_elems._32_5_ = local_3f8.data._M_elems._32_5_;
              local_3b8.data._M_elems[9]._1_3_ = local_3f8.data._M_elems[9]._1_3_;
              local_3b8.exp = local_3f8.exp;
              local_3b8.neg = local_3f8.neg;
              local_3b8._48_8_ = local_3f8._48_8_;
              local_318.data._M_elems[0] = local_438.data._M_elems[0];
              local_318.data._M_elems[1] = local_438.data._M_elems[1];
              local_318.data._M_elems[2] = local_438.data._M_elems[2];
              local_318.data._M_elems[3] = local_438.data._M_elems[3];
              local_318.data._M_elems[4] = local_438.data._M_elems[4];
              local_318.data._M_elems[5] = local_438.data._M_elems[5];
              local_318.data._M_elems[6] = local_438.data._M_elems[6];
              local_318.data._M_elems[7] = local_438.data._M_elems[7];
              local_318.data._M_elems[8] = local_438.data._M_elems[8];
              local_318.data._M_elems[9] = local_438.data._M_elems[9];
              local_318.exp = local_438.exp;
              local_318._48_8_ = local_438._48_8_;
            }
          }
        }
      }
      else {
        result.m_backend.data._M_elems[0] = local_358.m_backend.data._M_elems[0];
        result.m_backend.data._M_elems[1] = local_358.m_backend.data._M_elems[1];
        uVar3 = result.m_backend.data._M_elems._0_8_;
        result.m_backend.data._M_elems[2] = local_358.m_backend.data._M_elems[2];
        result.m_backend.data._M_elems[3] = local_358.m_backend.data._M_elems[3];
        result.m_backend.data._M_elems._32_5_ = local_358.m_backend.data._M_elems._32_5_;
        result.m_backend.data._M_elems[9]._1_3_ = local_358.m_backend.data._M_elems[9]._1_3_;
        result.m_backend.data._M_elems[4] = local_358.m_backend.data._M_elems[4];
        result.m_backend.data._M_elems[5] = local_358.m_backend.data._M_elems[5];
        result.m_backend.data._M_elems[6] = local_358.m_backend.data._M_elems[6];
        result.m_backend.data._M_elems[7] =
             (uint)(CONCAT35(local_358.m_backend.data._M_elems[7]._1_3_,
                             local_358.m_backend.data._M_elems._24_5_) >> 0x20);
        result.m_backend.exp = local_358.m_backend.exp;
        result.m_backend.neg = local_358.m_backend.neg;
        result.m_backend.fpclass = local_358.m_backend.fpclass;
        result.m_backend.prec_elem = local_358.m_backend.prec_elem;
        result.m_backend.data._M_elems[0] = local_358.m_backend.data._M_elems[0];
        if (local_358.m_backend.fpclass != cpp_dec_float_finite ||
            result.m_backend.data._M_elems[0] != 0) {
          result.m_backend.neg = (bool)(local_358.m_backend.neg ^ 1);
        }
        result.m_backend.data._M_elems._0_8_ = uVar3;
        tVar4 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_438,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result.m_backend);
        if (tVar4) {
          lVar10 = (long)iVar6 * 0x38;
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 10;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems[6] = 0;
          result.m_backend.data._M_elems[7] = 0;
          result.m_backend.data._M_elems._32_5_ = 0;
          result.m_backend.data._M_elems[9]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result.m_backend,
                     (cpp_dec_float<50U,_int,_void> *)(*(long *)(local_370 + 0xa28) + lVar10),
                     (cpp_dec_float<50U,_int,_void> *)(*plVar2 + lVar10));
          local_3f8.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
          local_3f8.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
          local_3f8.data._M_elems[4] = result.m_backend.data._M_elems[4];
          local_3f8.data._M_elems[5] = result.m_backend.data._M_elems[5];
          local_3f8.data._M_elems._24_5_ =
               SUB85(CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]),0
                    );
          local_3f8.data._M_elems[7]._1_3_ = (undefined3)(result.m_backend.data._M_elems[7] >> 8);
          local_3f8.data._M_elems[0] = result.m_backend.data._M_elems[0];
          local_3f8.data._M_elems[1] = result.m_backend.data._M_elems[1];
          local_3f8.data._M_elems[2] = result.m_backend.data._M_elems[2];
          local_3f8.data._M_elems[3] = result.m_backend.data._M_elems[3];
          local_3f8.exp = result.m_backend.exp;
          local_3f8.neg = result.m_backend.neg;
          local_3f8.fpclass = result.m_backend.fpclass;
          local_3f8.prec_elem = result.m_backend.prec_elem;
          tVar4 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_3f8,&degeneps);
          if (tVar4) {
            iVar7 = (*(this->
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      )._vptr_SPxRatioTester[3])(this);
            lVar8 = *plVar2;
            local_158.m_backend.data._M_elems._0_8_ = *(undefined8 *)(lVar8 + lVar10);
            local_158.m_backend.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar8 + lVar10) + 2);
            puVar1 = (uint *)(lVar8 + 0x10 + lVar10);
            local_158.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
            local_158.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
            local_158.m_backend.data._M_elems._32_8_ = *(undefined8 *)(lVar8 + 0x20 + lVar10);
            local_158.m_backend.exp = *(int *)(lVar8 + 0x28 + lVar10);
            local_158.m_backend.neg = *(bool *)(lVar8 + 0x2c + lVar10);
            local_158.m_backend._48_8_ = *(undefined8 *)(lVar8 + 0x30 + lVar10);
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::shiftLBbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(extraout_var_07,iVar7),iVar6,&local_158);
          }
          else {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                      (&local_3f8,&local_438);
            tVar4 = boost::multiprecision::operator<=
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_3f8,&local_218);
            if (tVar4) {
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 10;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems[6] = 0;
              result.m_backend.data._M_elems[7] = 0;
              result.m_backend.data._M_elems._32_5_ = 0;
              result.m_backend.data._M_elems[9]._1_3_ = 0;
              result.m_backend.exp = 0;
              result.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&result.m_backend,&local_3b8,&epsilon.m_backend);
              tVar4 = boost::multiprecision::operator>
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_3f8,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&result.m_backend);
              if (tVar4) {
                result_2.m_backend.data._M_elems[1] = local_438.data._M_elems[1];
                result_2.m_backend.data._M_elems[0] = local_438.data._M_elems[0];
                result_2.m_backend.data._M_elems[3] = local_438.data._M_elems[3];
                result_2.m_backend.data._M_elems[2] = local_438.data._M_elems[2];
                result_2.m_backend.data._M_elems[5] = local_438.data._M_elems[5];
                result_2.m_backend.data._M_elems[4] = local_438.data._M_elems[4];
                result_2.m_backend.data._M_elems._32_5_ =
                     SUB85(CONCAT44(local_438.data._M_elems[9],local_438.data._M_elems[8]),0);
                result_2.m_backend.data._M_elems[9]._1_3_ =
                     (undefined3)(local_438.data._M_elems[9] >> 8);
                result_2.m_backend.data._M_elems._24_5_ =
                     SUB85(CONCAT44(local_438.data._M_elems[7],local_438.data._M_elems[6]),0);
                result_2.m_backend.data._M_elems[7]._1_3_ =
                     (undefined3)(local_438.data._M_elems[7] >> 8);
                result_2.m_backend.exp = local_438.exp;
                result_2.m_backend.neg = local_438.neg;
                result_2.m_backend.fpclass = local_438.fpclass;
                result_2.m_backend.prec_elem = local_438.prec_elem;
                if (local_438.fpclass != cpp_dec_float_finite || local_438.data._M_elems[0] != 0) {
                  result_2.m_backend.neg = (bool)(local_438.neg ^ 1);
                }
                tVar4 = boost::multiprecision::operator>
                                  (&result_2,
                                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&local_318);
                if (tVar4) {
                  local_318.neg =
                       (bool)((local_438.data._M_elems[0] != 0 ||
                              local_438.fpclass != cpp_dec_float_finite) ^ local_438.neg);
                  local_48c = iVar6;
                  local_3b8.data._M_elems._0_8_ = local_3f8.data._M_elems._0_8_;
                  local_3b8.data._M_elems._8_8_ = local_3f8.data._M_elems._8_8_;
                  local_3b8.data._M_elems._16_8_ = local_3f8.data._M_elems._16_8_;
                  local_3b8.data._M_elems._24_5_ = local_3f8.data._M_elems._24_5_;
                  local_3b8.data._M_elems[7]._1_3_ = local_3f8.data._M_elems[7]._1_3_;
                  local_3b8.data._M_elems._32_5_ = local_3f8.data._M_elems._32_5_;
                  local_3b8.data._M_elems[9]._1_3_ = local_3f8.data._M_elems[9]._1_3_;
                  local_3b8.exp = local_3f8.exp;
                  local_3b8.neg = local_3f8.neg;
                  local_3b8._48_8_ = local_3f8._48_8_;
                  local_318.data._M_elems[0] = local_438.data._M_elems[0];
                  local_318.data._M_elems[1] = local_438.data._M_elems[1];
                  local_318.data._M_elems[2] = local_438.data._M_elems[2];
                  local_318.data._M_elems[3] = local_438.data._M_elems[3];
                  local_318.data._M_elems[4] = local_438.data._M_elems[4];
                  local_318.data._M_elems[5] = local_438.data._M_elems[5];
                  local_318.data._M_elems[6] = local_438.data._M_elems[6];
                  local_318.data._M_elems[7] = local_438.data._M_elems[7];
                  local_318.data._M_elems[8] = local_438.data._M_elems[8];
                  local_318.data._M_elems[9] = local_438.data._M_elems[9];
                  local_318.exp = local_438.exp;
                  local_318._48_8_ = local_438._48_8_;
                }
              }
            }
          }
        }
        else {
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::clearNum(local_360,n);
        }
      }
    }
  }
  else {
    result.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
    result.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
    uVar3 = result.m_backend.data._M_elems._0_8_;
    result.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
    result.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
    result.m_backend.data._M_elems._32_5_ = epsilon.m_backend.data._M_elems._32_5_;
    result.m_backend.data._M_elems[9]._1_3_ = epsilon.m_backend.data._M_elems[9]._1_3_;
    result.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
    result.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
    result.m_backend.data._M_elems[6] = epsilon.m_backend.data._M_elems[6];
    result.m_backend.data._M_elems[7] = epsilon.m_backend.data._M_elems[7];
    result.m_backend.exp = epsilon.m_backend.exp;
    result.m_backend.neg = epsilon.m_backend.neg;
    result.m_backend.fpclass = epsilon.m_backend.fpclass;
    result.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    result.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
    if (epsilon.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0)
    {
      result.m_backend.neg = (bool)(epsilon.m_backend.neg ^ 1);
    }
    result.m_backend.data._M_elems._0_8_ = uVar3;
    tVar4 = boost::multiprecision::operator<(&local_218,&result);
    if (!tVar4) {
      return -1;
    }
    minDelta(this,&maxabs,&local_218,*(int *)(local_378 + 0x58),*(int **)(local_378 + 0x60),
             *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               **)(local_378 + 0x70),
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)*plVar2,
             *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               **)(local_370 + 0xa28),
             *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               **)(local_2e0 + 0xa10));
    bVar5 = boost::multiprecision::operator==(&local_218,val);
    if (bVar5) {
      return -1;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&local_318,0);
    pdVar9 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&result.m_backend,*pdVar9,(type *)0x0);
    local_3b8.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
    local_3b8.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
    local_3b8.data._M_elems[4] = result.m_backend.data._M_elems[4];
    local_3b8.data._M_elems[5] = result.m_backend.data._M_elems[5];
    local_3b8.data._M_elems._24_5_ =
         SUB85(CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]),0);
    local_3b8.data._M_elems[7]._1_3_ = (undefined3)(result.m_backend.data._M_elems[7] >> 8);
    local_3b8.data._M_elems[0] = result.m_backend.data._M_elems[0];
    local_3b8.data._M_elems[1] = result.m_backend.data._M_elems[1];
    local_3b8.data._M_elems[2] = result.m_backend.data._M_elems[2];
    local_3b8.data._M_elems[3] = result.m_backend.data._M_elems[3];
    local_3b8.exp = result.m_backend.exp;
    local_3b8.neg = result.m_backend.neg;
    local_3b8.fpclass = result.m_backend.fpclass;
    local_3b8.prec_elem = result.m_backend.prec_elem;
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 10;
    result_2.m_backend.data._M_elems[0] = 0;
    result_2.m_backend.data._M_elems[1] = 0;
    result_2.m_backend.data._M_elems[2] = 0;
    result_2.m_backend.data._M_elems[3] = 0;
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems._24_5_ = 0;
    result_2.m_backend.data._M_elems[7]._1_3_ = 0;
    result_2.m_backend.data._M_elems._32_5_ = 0;
    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result_2.m_backend,&maxabs.m_backend,&epsilon.m_backend);
    local_220 = 0.001;
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 10;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems._32_5_ = 0;
    result.m_backend.data._M_elems[9]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
              (&result.m_backend,&result_2.m_backend,&local_220);
    local_358.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
    local_358.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
    local_358.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
    local_358.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
    local_358.m_backend.data._M_elems._24_5_ =
         SUB85(CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]),0);
    local_358.m_backend.data._M_elems[7]._1_3_ =
         (undefined3)(result.m_backend.data._M_elems[7] >> 8);
    local_358.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
    local_358.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
    local_358.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
    local_358.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
    local_358.m_backend.exp = result.m_backend.exp;
    local_358.m_backend.neg = result.m_backend.neg;
    local_358.m_backend.fpclass = result.m_backend.fpclass;
    local_358.m_backend.prec_elem = result.m_backend.prec_elem;
    tVar4 = boost::multiprecision::operator<
                      (&local_358,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&epsilon.m_backend);
    if (tVar4) {
      local_358.m_backend.data._M_elems._32_5_ = epsilon.m_backend.data._M_elems._32_5_;
      local_358.m_backend.data._M_elems[9]._1_3_ = epsilon.m_backend.data._M_elems[9]._1_3_;
      local_358.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
      local_358.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
      local_358.m_backend.data._M_elems._24_5_ = epsilon.m_backend.data._M_elems._24_5_;
      local_358.m_backend.data._M_elems[7]._1_3_ = epsilon.m_backend.data._M_elems[7]._1_3_;
      local_358.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
      local_358.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
      local_358.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
      local_358.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
      local_358.m_backend.exp = epsilon.m_backend.exp;
      local_358.m_backend.neg = epsilon.m_backend.neg;
      local_358.m_backend.fpclass = epsilon.m_backend.fpclass;
      local_358.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    }
    uVar11 = (ulong)*(uint *)(local_378 + 0x58);
    local_48c = -1;
    while (0 < (int)uVar11) {
      local_368 = uVar11 - 1;
      iVar6 = *(int *)(*(long *)(local_378 + 0x60) + (local_368 & 0xffffffff) * 4);
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&result.m_backend,local_360,iVar6);
      local_438.data._M_elems[8] = result.m_backend.data._M_elems[8];
      local_438.data._M_elems[9] =
           (uint)(CONCAT35(result.m_backend.data._M_elems[9]._1_3_,
                           result.m_backend.data._M_elems._32_5_) >> 0x20);
      local_438.data._M_elems[4] = result.m_backend.data._M_elems[4];
      local_438.data._M_elems[5] = result.m_backend.data._M_elems[5];
      local_438.data._M_elems[6] = result.m_backend.data._M_elems[6];
      local_438.data._M_elems[7] = result.m_backend.data._M_elems[7];
      local_438.data._M_elems[0] = result.m_backend.data._M_elems[0];
      local_438.data._M_elems[1] = result.m_backend.data._M_elems[1];
      local_438.data._M_elems[2] = result.m_backend.data._M_elems[2];
      local_438.data._M_elems[3] = result.m_backend.data._M_elems[3];
      local_438.exp = result.m_backend.exp;
      local_438.neg = result.m_backend.neg;
      local_438.fpclass = result.m_backend.fpclass;
      local_438.prec_elem = result.m_backend.prec_elem;
      result.m_backend.data._M_elems._32_5_ = local_358.m_backend.data._M_elems._32_5_;
      result.m_backend.data._M_elems[9]._1_3_ = local_358.m_backend.data._M_elems[9]._1_3_;
      result.m_backend.data._M_elems[4] = local_358.m_backend.data._M_elems[4];
      result.m_backend.data._M_elems[5] = local_358.m_backend.data._M_elems[5];
      result.m_backend.data._M_elems[6] = local_358.m_backend.data._M_elems[6];
      result.m_backend.data._M_elems[7] =
           (uint)(CONCAT35(local_358.m_backend.data._M_elems[7]._1_3_,
                           local_358.m_backend.data._M_elems._24_5_) >> 0x20);
      result.m_backend.data._M_elems[0] = local_358.m_backend.data._M_elems[0];
      result.m_backend.data._M_elems[1] = local_358.m_backend.data._M_elems[1];
      uVar3 = result.m_backend.data._M_elems._0_8_;
      result.m_backend.data._M_elems[2] = local_358.m_backend.data._M_elems[2];
      result.m_backend.data._M_elems[3] = local_358.m_backend.data._M_elems[3];
      result.m_backend.exp = local_358.m_backend.exp;
      result.m_backend.neg = local_358.m_backend.neg;
      result.m_backend.fpclass = local_358.m_backend.fpclass;
      result.m_backend.prec_elem = local_358.m_backend.prec_elem;
      result.m_backend.data._M_elems[0] = local_358.m_backend.data._M_elems[0];
      if (local_358.m_backend.fpclass != cpp_dec_float_finite ||
          result.m_backend.data._M_elems[0] != 0) {
        result.m_backend.neg = (bool)(local_358.m_backend.neg ^ 1);
      }
      result.m_backend.data._M_elems._0_8_ = uVar3;
      tVar4 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_438,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result.m_backend);
      if (tVar4) {
        lVar10 = (long)iVar6 * 0x38;
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 10;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems[6] = 0;
        result.m_backend.data._M_elems[7] = 0;
        result.m_backend.data._M_elems._32_5_ = 0;
        result.m_backend.data._M_elems[9]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result.m_backend,
                   (cpp_dec_float<50U,_int,_void> *)(*(long *)(local_2e0 + 0xa10) + lVar10),
                   (cpp_dec_float<50U,_int,_void> *)(*plVar2 + lVar10));
        local_3f8.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
        local_3f8.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
        local_3f8.data._M_elems[4] = result.m_backend.data._M_elems[4];
        local_3f8.data._M_elems[5] = result.m_backend.data._M_elems[5];
        local_3f8.data._M_elems._24_5_ =
             SUB85(CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]),0);
        local_3f8.data._M_elems[7]._1_3_ = (undefined3)(result.m_backend.data._M_elems[7] >> 8);
        local_3f8.data._M_elems[0] = result.m_backend.data._M_elems[0];
        local_3f8.data._M_elems[1] = result.m_backend.data._M_elems[1];
        local_3f8.data._M_elems[2] = result.m_backend.data._M_elems[2];
        local_3f8.data._M_elems[3] = result.m_backend.data._M_elems[3];
        local_3f8.exp = result.m_backend.exp;
        local_3f8.neg = result.m_backend.neg;
        local_3f8.fpclass = result.m_backend.fpclass;
        local_3f8.prec_elem = result.m_backend.prec_elem;
        result.m_backend.data._M_elems._32_5_ = degeneps.m_backend.data._M_elems._32_5_;
        result.m_backend.data._M_elems[9]._1_3_ = degeneps.m_backend.data._M_elems[9]._1_3_;
        result.m_backend.data._M_elems[4] = degeneps.m_backend.data._M_elems[4];
        result.m_backend.data._M_elems[5] = degeneps.m_backend.data._M_elems[5];
        result.m_backend.data._M_elems[6] = degeneps.m_backend.data._M_elems[6];
        result.m_backend.data._M_elems[7] = degeneps.m_backend.data._M_elems[7];
        result.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
        result.m_backend.data._M_elems[1] = degeneps.m_backend.data._M_elems[1];
        uVar3 = result.m_backend.data._M_elems._0_8_;
        result.m_backend.data._M_elems[2] = degeneps.m_backend.data._M_elems[2];
        result.m_backend.data._M_elems[3] = degeneps.m_backend.data._M_elems[3];
        result.m_backend.exp = degeneps.m_backend.exp;
        result.m_backend.neg = degeneps.m_backend.neg;
        result.m_backend.fpclass = degeneps.m_backend.fpclass;
        result.m_backend.prec_elem = degeneps.m_backend.prec_elem;
        result.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
        if (degeneps.m_backend.fpclass != cpp_dec_float_finite ||
            result.m_backend.data._M_elems[0] != 0) {
          result.m_backend.neg = (bool)(degeneps.m_backend.neg ^ 1);
        }
        result.m_backend.data._M_elems._0_8_ = uVar3;
        tVar4 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_3f8,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result.m_backend);
        uVar11 = local_368;
        if (tVar4) {
          iVar7 = (*(this->
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._vptr_SPxRatioTester[3])(this);
          lVar8 = *plVar2;
          local_198.m_backend.data._M_elems._0_8_ = *(undefined8 *)(lVar8 + lVar10);
          local_198.m_backend.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar8 + lVar10) + 2);
          puVar1 = (uint *)(lVar8 + 0x10 + lVar10);
          local_198.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          local_198.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
          local_198.m_backend.data._M_elems._32_8_ = *(undefined8 *)(lVar8 + 0x20 + lVar10);
          local_198.m_backend.exp = *(int *)(lVar8 + 0x28 + lVar10);
          local_198.m_backend.neg = *(bool *)(lVar8 + 0x2c + lVar10);
          local_198.m_backend._48_8_ = *(undefined8 *)(lVar8 + 0x30 + lVar10);
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::shiftUBbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)CONCAT44(extraout_var_08,iVar7),iVar6,&local_198);
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                    (&local_3f8,&local_438);
          tVar4 = boost::multiprecision::operator>=
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_3f8,&local_218);
          if (tVar4) {
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 10;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems._32_5_ = 0;
            result.m_backend.data._M_elems[9]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result.m_backend,&local_3b8,&epsilon.m_backend);
            tVar4 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_3f8,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&result.m_backend);
            if (tVar4) {
              result_2.m_backend.data._M_elems[1] = local_438.data._M_elems[1];
              result_2.m_backend.data._M_elems[0] = local_438.data._M_elems[0];
              result_2.m_backend.data._M_elems[3] = local_438.data._M_elems[3];
              result_2.m_backend.data._M_elems[2] = local_438.data._M_elems[2];
              result_2.m_backend.data._M_elems[5] = local_438.data._M_elems[5];
              result_2.m_backend.data._M_elems[4] = local_438.data._M_elems[4];
              result_2.m_backend.data._M_elems._32_5_ =
                   SUB85(CONCAT44(local_438.data._M_elems[9],local_438.data._M_elems[8]),0);
              result_2.m_backend.data._M_elems[9]._1_3_ =
                   (undefined3)(local_438.data._M_elems[9] >> 8);
              result_2.m_backend.data._M_elems._24_5_ =
                   SUB85(CONCAT44(local_438.data._M_elems[7],local_438.data._M_elems[6]),0);
              result_2.m_backend.data._M_elems[7]._1_3_ =
                   (undefined3)(local_438.data._M_elems[7] >> 8);
              result_2.m_backend.exp = local_438.exp;
              result_2.m_backend.neg = local_438.neg;
              result_2.m_backend.fpclass = local_438.fpclass;
              result_2.m_backend.prec_elem = local_438.prec_elem;
              if (local_438.fpclass != cpp_dec_float_finite || local_438.data._M_elems[0] != 0) {
                result_2.m_backend.neg = (bool)(local_438.neg ^ 1);
              }
              tVar4 = boost::multiprecision::operator>
                                (&result_2,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_318);
              if (tVar4) {
                local_318.neg =
                     (bool)((local_438.data._M_elems[0] != 0 ||
                            local_438.fpclass != cpp_dec_float_finite) ^ local_438.neg);
                local_48c = iVar6;
                local_3b8.data._M_elems._0_8_ = local_3f8.data._M_elems._0_8_;
                local_3b8.data._M_elems._8_8_ = local_3f8.data._M_elems._8_8_;
                local_3b8.data._M_elems._16_8_ = local_3f8.data._M_elems._16_8_;
                local_3b8.data._M_elems._24_5_ = local_3f8.data._M_elems._24_5_;
                local_3b8.data._M_elems[7]._1_3_ = local_3f8.data._M_elems[7]._1_3_;
                local_3b8.data._M_elems._32_5_ = local_3f8.data._M_elems._32_5_;
                local_3b8.data._M_elems[9]._1_3_ = local_3f8.data._M_elems[9]._1_3_;
                local_3b8.exp = local_3f8.exp;
                local_3b8.neg = local_3f8.neg;
                local_3b8._48_8_ = local_3f8._48_8_;
                local_318.data._M_elems[0] = local_438.data._M_elems[0];
                local_318.data._M_elems[1] = local_438.data._M_elems[1];
                local_318.data._M_elems[2] = local_438.data._M_elems[2];
                local_318.data._M_elems[3] = local_438.data._M_elems[3];
                local_318.data._M_elems[4] = local_438.data._M_elems[4];
                local_318.data._M_elems[5] = local_438.data._M_elems[5];
                local_318.data._M_elems[6] = local_438.data._M_elems[6];
                local_318.data._M_elems[7] = local_438.data._M_elems[7];
                local_318.data._M_elems[8] = local_438.data._M_elems[8];
                local_318.data._M_elems[9] = local_438.data._M_elems[9];
                local_318.exp = local_438.exp;
                local_318._48_8_ = local_438._48_8_;
              }
            }
          }
        }
      }
      else {
        tVar4 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_438,&local_358);
        uVar11 = local_368;
        if (tVar4) {
          lVar10 = (long)iVar6 * 0x38;
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 10;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems[6] = 0;
          result.m_backend.data._M_elems[7] = 0;
          result.m_backend.data._M_elems._32_5_ = 0;
          result.m_backend.data._M_elems[9]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result.m_backend,
                     (cpp_dec_float<50U,_int,_void> *)(*(long *)(local_370 + 0xa28) + lVar10),
                     (cpp_dec_float<50U,_int,_void> *)(*plVar2 + lVar10));
          local_3f8.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
          local_3f8.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
          local_3f8.data._M_elems[4] = result.m_backend.data._M_elems[4];
          local_3f8.data._M_elems[5] = result.m_backend.data._M_elems[5];
          local_3f8.data._M_elems._24_5_ =
               SUB85(CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]),0
                    );
          local_3f8.data._M_elems[7]._1_3_ = (undefined3)(result.m_backend.data._M_elems[7] >> 8);
          local_3f8.data._M_elems[0] = result.m_backend.data._M_elems[0];
          local_3f8.data._M_elems[1] = result.m_backend.data._M_elems[1];
          local_3f8.data._M_elems[2] = result.m_backend.data._M_elems[2];
          local_3f8.data._M_elems[3] = result.m_backend.data._M_elems[3];
          local_3f8.exp = result.m_backend.exp;
          local_3f8.neg = result.m_backend.neg;
          local_3f8.fpclass = result.m_backend.fpclass;
          local_3f8.prec_elem = result.m_backend.prec_elem;
          tVar4 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_3f8,&degeneps);
          uVar11 = local_368;
          if (tVar4) {
            iVar7 = (*(this->
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      )._vptr_SPxRatioTester[3])(this);
            lVar8 = *plVar2;
            local_1d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(lVar8 + lVar10);
            local_1d8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar8 + lVar10) + 2);
            puVar1 = (uint *)(lVar8 + 0x10 + lVar10);
            local_1d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
            local_1d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
            local_1d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(lVar8 + 0x20 + lVar10);
            local_1d8.m_backend.exp = *(int *)(lVar8 + 0x28 + lVar10);
            local_1d8.m_backend.neg = *(bool *)(lVar8 + 0x2c + lVar10);
            local_1d8.m_backend._48_8_ = *(undefined8 *)(lVar8 + 0x30 + lVar10);
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::shiftLBbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(extraout_var_09,iVar7),iVar6,&local_1d8);
          }
          else {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                      (&local_3f8,&local_438);
            tVar4 = boost::multiprecision::operator>=
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_3f8,&local_218);
            if (tVar4) {
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 10;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems[6] = 0;
              result.m_backend.data._M_elems[7] = 0;
              result.m_backend.data._M_elems._32_5_ = 0;
              result.m_backend.data._M_elems[9]._1_3_ = 0;
              result.m_backend.exp = 0;
              result.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&result.m_backend,&local_3b8,&epsilon.m_backend);
              uVar11 = local_368;
              tVar4 = boost::multiprecision::operator<
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_3f8,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&result.m_backend);
              if ((tVar4) &&
                 (tVar4 = boost::multiprecision::operator>
                                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_438,
                                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_318), tVar4)) {
                local_318.neg = local_438.neg;
                local_48c = iVar6;
                local_3b8.data._M_elems._0_8_ = local_3f8.data._M_elems._0_8_;
                local_3b8.data._M_elems._8_8_ = local_3f8.data._M_elems._8_8_;
                local_3b8.data._M_elems._16_8_ = local_3f8.data._M_elems._16_8_;
                local_3b8.data._M_elems._24_5_ = local_3f8.data._M_elems._24_5_;
                local_3b8.data._M_elems[7]._1_3_ = local_3f8.data._M_elems[7]._1_3_;
                local_3b8.data._M_elems._32_5_ = local_3f8.data._M_elems._32_5_;
                local_3b8.data._M_elems[9]._1_3_ = local_3f8.data._M_elems[9]._1_3_;
                local_3b8.exp = local_3f8.exp;
                local_3b8.neg = local_3f8.neg;
                local_3b8._48_8_ = local_3f8._48_8_;
                local_318.data._M_elems[0] = local_438.data._M_elems[0];
                local_318.data._M_elems[1] = local_438.data._M_elems[1];
                local_318.data._M_elems[2] = local_438.data._M_elems[2];
                local_318.data._M_elems[3] = local_438.data._M_elems[3];
                local_318.data._M_elems[4] = local_438.data._M_elems[4];
                local_318.data._M_elems[5] = local_438.data._M_elems[5];
                local_318.data._M_elems[6] = local_438.data._M_elems[6];
                local_318.data._M_elems[7] = local_438.data._M_elems[7];
                local_318.data._M_elems[8] = local_438.data._M_elems[8];
                local_318.data._M_elems[9] = local_438.data._M_elems[9];
                local_318.exp = local_438.exp;
                local_318._48_8_ = local_438._48_8_;
              }
            }
          }
        }
        else {
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::clearNum(local_360,(int)local_368);
        }
      }
    }
  }
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar6) + 0x368))
            (&result,(long *)CONCAT44(extraout_var_10,iVar6));
  bVar5 = boost::multiprecision::operator!=(&local_d8,&result);
  if (bVar5) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_68,0,(type *)0x0);
    local_48c = (*(this->
                  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._vptr_SPxRatioTester[7])(this,val,&local_68,0);
  }
  else {
    *(ulong *)((val->m_backend).data._M_elems + 8) =
         CONCAT35(local_3b8.data._M_elems[9]._1_3_,local_3b8.data._M_elems._32_5_);
    *(undefined8 *)((val->m_backend).data._M_elems + 4) = local_3b8.data._M_elems._16_8_;
    *(ulong *)((val->m_backend).data._M_elems + 6) =
         CONCAT35(local_3b8.data._M_elems[7]._1_3_,local_3b8.data._M_elems._24_5_);
    *(undefined8 *)(val->m_backend).data._M_elems = local_3b8.data._M_elems._0_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 2) = local_3b8.data._M_elems._8_8_;
    (val->m_backend).exp = local_3b8.exp;
    (val->m_backend).neg = local_3b8.neg;
    (val->m_backend).fpclass = local_3b8.fpclass;
    (val->m_backend).prec_elem = local_3b8.prec_elem;
  }
  return local_48c;
}

Assistant:

int SPxHarrisRT<R>::selectLeave(R& val, R, bool)
{
   int i, j;
   R stab, x, y;
   R max;
   R sel;
   R lastshift;
   R useeps;
   int leave = -1;
   R maxabs = 1;

   R epsilon  = this->solver()->epsilon();
   R degeneps = degenerateEps();

   SSVectorBase<R>& upd = this->solver()->fVec().delta();
   VectorBase<R>& vec = this->solver()->fVec();

   const VectorBase<R>& up = this->solver()->ubBound();
   const VectorBase<R>& low = this->solver()->lbBound();

   assert(this->delta > epsilon);
   assert(epsilon > 0);
   assert(this->solver()->maxCycle() > 0);

   max = val;
   lastshift = this->solver()->shift();

   this->solver()->fVec().delta().setup();

   if(max > epsilon)
   {
      // phase 1:
      maxDelta(
         &maxabs,             /* max abs value in upd */
         &max,                /* initial and chosen value */
         upd.size(),          /* # of indices in upd */
         upd.indexMem(),      /* nonzero indices in upd */
         upd.values(),        /* update VectorBase<R> for vec */
         vec.get_const_ptr(),         /* current VectorBase<R> */
         low.get_const_ptr(),                 /* lower bounds for vec */
         up.get_const_ptr()                   /* upper bounds for vec */
      );

      if(max == val)
         return -1;


      // phase 2:
      stab = 0;
      sel = R(-infinity);
      useeps = maxabs * epsilon * 0.001;

      if(useeps < epsilon)
         useeps = epsilon;

      for(j = upd.size() - 1; j >= 0; --j)
      {
         i = upd.index(j);
         x = upd[i];

         if(x > useeps)
         {
            y = up[i] - vec[i];

            if(y < -degeneps)
               this->solver()->shiftUBbound(i, vec[i]); // ensure simplex improvement
            else
            {
               y /= x;

               if(y <= max && y > sel - epsilon && x > stab)
               {
                  sel = y;
                  leave = i;
                  stab = x;
               }
            }
         }
         else if(x < -useeps)
         {
            y = low[i] - vec[i];

            if(y > degeneps)
               this->solver()->shiftLBbound(i, vec[i]); // ensure simplex improvement
            else
            {
               y /= x;

               if(y <= max && y > sel - epsilon && -x > stab)
               {
                  sel = y;
                  leave = i;
                  stab = -x;
               }
            }
         }
         else
            upd.clearNum(j);
      }
   }


   else if(max < -epsilon)
   {
      // phase 1:
      minDelta(
         &maxabs,             /* max abs value in upd */
         &max,                /* initial and chosen value */
         upd.size(),          /* # of indices in upd */
         upd.indexMem(),      /* nonzero indices in upd */
         upd.values(),        /* update VectorBase<R> for vec */
         vec.get_const_ptr(),                 /* current VectorBase<R> */
         low.get_const_ptr(),                 /* lower bounds for vec */
         up.get_const_ptr()                   /* upper bounds for vec */
      );

      if(max == val)
         return -1;

      // phase 2:
      stab = 0;
      sel = R(infinity);
      useeps = maxabs * epsilon * 0.001;

      if(useeps < epsilon)
         useeps = epsilon;

      for(j = upd.size() - 1; j >= 0; --j)
      {
         i = upd.index(j);
         x = upd[i];

         if(x < -useeps)
         {
            y = up[i] - vec[i];

            if(y < -degeneps)
               this->solver()->shiftUBbound(i, vec[i]);   // ensure simplex improvement
            else
            {
               y /= x;

               if(y >= max && y < sel + epsilon && -x > stab)
               {
                  sel = y;
                  leave = i;
                  stab = -x;
               }
            }
         }
         else if(x > useeps)
         {
            y = low[i] - vec[i];

            if(y > degeneps)
               this->solver()->shiftLBbound(i, vec[i]); // ensure simplex improvement
            else
            {
               y /= x;

               if(y >= max && y < sel + epsilon && x > stab)
               {
                  sel = y;
                  leave = i;
                  stab = x;
               }
            }
         }
         else
            upd.clearNum(j);
      }
   }

   else
      return -1;


   if(lastshift != this->solver()->shift())
      return selectLeave(val, 0, false);

   assert(leave >= 0);

   val = sel;
   return leave;
}